

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.h
# Opt level: O0

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* GetStringTokens(vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *__return_storage_ptr__,string_view *signature)

{
  int iVar1;
  const_reference pvVar2;
  ostream *poVar3;
  void *this;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_type local_30;
  size_t idx;
  size_t idx_start;
  _tokenizer_state state;
  string_view *signature_local;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *token_vector;
  
  idx_start._7_1_ = 0;
  _state = signature;
  signature_local = (string_view *)__return_storage_ptr__;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(__return_storage_ptr__);
  idx_start._0_4_ = 0;
  idx = 0;
  local_30 = 0;
  do {
    if ((int)idx_start == 0) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](_state,local_30);
      if (*pvVar2 == '%') {
        poVar3 = std::operator<<((ostream *)&std::cout,"% found at ");
        this = (void *)std::ostream::operator<<(poVar3,local_30);
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        idx_start._0_4_ = 1;
      }
      else {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](_state,local_30);
        if (*pvVar2 == '\0') {
          poVar3 = std::operator<<((ostream *)&std::cout,"str ends at ");
          std::ostream::operator<<(poVar3,local_30);
          poVar3 = std::operator<<((ostream *)&std::cout,", making substr(");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,idx);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_30 - idx);
          poVar3 = std::operator<<(poVar3,")");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          poVar3 = std::operator<<((ostream *)&std::cout,"substr = ");
          local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (_state,idx,local_30 - idx);
          pbVar4 = std::operator<<(poVar3,local_50);
          std::ostream::operator<<(pbVar4,std::endl<char,std::char_traits<char>>);
          local_60 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (_state,idx,local_30 - idx);
          std::
          vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                    ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)__return_storage_ptr__,&local_60);
          return __return_storage_ptr__;
        }
      }
    }
    else {
      idx_start._0_4_ = 0;
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](_state,local_30);
      iVar1 = (int)*pvVar2;
      if ((((*pvVar2 == '\0') || (iVar1 - 99U < 2)) || (iVar1 == 0x66)) ||
         ((iVar1 == 0x69 || (iVar1 == 0x73)))) {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](_state,local_30);
        poVar3 = std::operator<<((ostream *)&std::cout,*pvVar2);
        poVar3 = std::operator<<(poVar3," found after % at ");
        std::ostream::operator<<(poVar3,local_30);
        poVar3 = std::operator<<((ostream *)&std::cout,", making substr(");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,idx);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,~idx + local_30);
        poVar3 = std::operator<<(poVar3,")");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,"substr = ");
        bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (_state,idx,~idx + local_30);
        local_70 = bVar5;
        pbVar4 = std::operator<<(poVar3,bVar5);
        std::ostream::operator<<(pbVar4,std::endl<char,std::char_traits<char>>);
        bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (_state,idx,~idx + local_30);
        local_80 = bVar5;
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)__return_storage_ptr__,&local_80);
        idx = local_30 + 1;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

std::vector<std::string_view> GetStringTokens(const std::string_view& signature) {
    std::vector<std::string_view> token_vector;
    _tokenizer_state state = TNORMAL;
    size_t idx_start = 0, idx = 0;
    while (true) {
        if (state == TNORMAL) {
            if (signature[idx] == '%') {
                std::cout << "% found at " << idx << std::endl;
                state = TPERC;
            } else if (signature[idx] == '\0') {
                std::cout << "str ends at " << idx;
                std::cout << ", making substr(" << idx_start << ", " << idx - idx_start << ")" << std::endl;
                std::cout << "substr = " << signature.substr(idx_start, idx - idx_start) << std::endl;
                token_vector.emplace_back(signature.substr(idx_start, idx - idx_start));
                break;
            }
            ++idx;
        } else {
            state = TNORMAL;
            switch (signature[idx]) {
            case 's':
            case 'c':
            case 'i':
            case 'd':
            case 'f':
            case '\0':
                std::cout << signature[idx] << " found after % at " << idx;
                std::cout << ", making substr(" << idx_start << ", " << idx - idx_start - 1 << ")" << std::endl;
                std::cout << "substr = " << signature.substr(idx_start, idx - idx_start - 1) << std::endl;
                token_vector.emplace_back(signature.substr(idx_start, idx - idx_start - 1));
                idx_start = idx + 1;
                break;
            default:
                break;
            }
            ++idx;
        }
    }

    return token_vector;
}